

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

void __thiscall deqp::gles31::bb::BlockLayoutEntry::~BlockLayoutEntry(BlockLayoutEntry *this)

{
  BlockLayoutEntry *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->activeVarIndices);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

BlockLayoutEntry (void)
		: size(0)
	{
	}